

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O2

bool __thiscall Analyser::Static::Commodore::File::is_basic(File *this)

{
  ushort uVar1;
  pointer puVar2;
  pointer puVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  pointer puVar7;
  
  if (this->type == RelocatableProgram) {
    puVar2 = (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar3 = (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = (uint)this->starting_address;
    uVar6 = 0xffffffff;
    while (puVar7 = (pointer)(long)(int)(uVar5 - this->starting_address),
          puVar7 < puVar2 + (2 - (long)puVar3)) {
      uVar1 = *(ushort *)(puVar7 + (long)puVar3);
      if (uVar1 == 0) {
        return true;
      }
      if (puVar2 + (5 - (long)puVar3) <= puVar7) {
        return false;
      }
      if ((uint)uVar1 < uVar5 + 5) {
        return false;
      }
      bVar4 = (int)(uint)*(ushort *)(puVar7 + (long)(puVar3 + 2)) <= (int)uVar6;
      uVar5 = (uint)uVar1;
      uVar6 = (uint)*(ushort *)(puVar7 + (long)(puVar3 + 2));
      if (bVar4) {
        return false;
      }
    }
  }
  return false;
}

Assistant:

bool Analyser::Static::Commodore::File::is_basic() {
	// BASIC files are always relocatable (?)
	if(type != File::RelocatableProgram) return false;

	uint16_t line_address = starting_address;
	int line_number = -1;

	// decide whether this is a BASIC file based on the proposition that:
	//	(1) they're always relocatable; and
	//	(2) they have a per-line structure of:
	//		[4 bytes: address of start of next line]
	//		[4 bytes: this line number]
	//		... null-terminated code ...
	//	(with a next line address of 0000 indicating end of program)
	while(1) {
		if(size_t(line_address - starting_address) >= data.size() + 2) break;

		uint16_t next_line_address = data[line_address - starting_address];
		next_line_address |= data[line_address - starting_address + 1] << 8;

		if(!next_line_address) {
			return true;
		}
		if(next_line_address < line_address + 5) break;

		if(size_t(line_address - starting_address) >= data.size() + 5) break;
		uint16_t next_line_number = data[line_address - starting_address + 2];
		next_line_number |= data[line_address - starting_address + 3] << 8;

		if(next_line_number <= line_number) break;

		line_number = uint16_t(next_line_number);
		line_address = next_line_address;
	}

	return false;
}